

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.c
# Opt level: O3

void Queue_Push_Front(Queue *q,void *data)

{
  Queue_Node *pQVar1;
  Queue_Node *temp;
  Queue_Node *pQVar2;
  
  if (q != (Queue *)0x0) {
    pQVar1 = q->first;
    pQVar2 = (Queue_Node *)malloc(0x10);
    if (pQVar1 == (Queue_Node *)0x0) {
      q->last = pQVar2;
      q->first = pQVar2;
      pQVar2->data = data;
      pQVar2->prev = (Queue_Node *)0x0;
    }
    else {
      pQVar2->prev = pQVar1;
      pQVar2->data = data;
      q->first = pQVar2;
    }
    q->size = q->size + 1;
  }
  return;
}

Assistant:

void Queue_Push_Front(struct Queue *q,void *data)
{
	if(q==NULL)return;
	if(q->first==NULL)
	{
		q->first=q->last=malloc(sizeof(struct Queue_Node));	

		q->first->data=data;
		q->last->prev=NULL;

		++q->size;
	}else
	{
		struct Queue_Node *temp=malloc(sizeof(struct Queue_Node));
		temp->prev=q->first;
		temp->data=data;

		q->first=temp;
		++q->size;
	}

}